

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cc
# Opt level: O2

void __thiscall
phosg::Image::Image(Image *this,size_t x,size_t y,bool has_alpha,uint8_t channel_width)

{
  size_t __size;
  void *pvVar1;
  
  this->width = x;
  this->height = y;
  this->has_alpha = has_alpha;
  this->channel_width = channel_width;
  this->max_value = 0xffffffffffffffff >> (-channel_width & 0x3f);
  __size = get_data_size(this);
  pvVar1 = calloc(1,__size);
  (this->data).raw = pvVar1;
  return;
}

Assistant:

Image::Image(size_t x, size_t y, bool has_alpha, uint8_t channel_width)
    : width(x),
      height(y),
      has_alpha(has_alpha),
      channel_width(channel_width),
      max_value(mask_for_width(this->channel_width)) {
  size_t num_bytes = this->get_data_size();
  this->data.raw = malloc(num_bytes);
  memset(this->data.raw, 0, num_bytes * sizeof(uint8_t));
}